

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u32 sqlite3FkOldmask(Parse *pParse,Table *pTab)

{
  int iVar1;
  FKey *pFVar2;
  HashElem *pHVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  u32 uVar7;
  Index *pIdx;
  Index *local_38;
  
  uVar7 = 0;
  if ((pParse->db->flags & 0x4000) != 0) {
    uVar7 = 0;
    for (pFVar2 = pTab->pFKey; pFVar2 != (FKey *)0x0; pFVar2 = pFVar2->pNextFrom) {
      if (0 < (long)pFVar2->nCol) {
        lVar6 = 0;
        do {
          iVar1 = *(int *)((long)&pFVar2->aCol[0].iFrom + lVar6);
          uVar5 = 1 << ((byte)iVar1 & 0x1f);
          if (0x1f < iVar1) {
            uVar5 = 0xffffffff;
          }
          uVar7 = uVar7 | uVar5;
          lVar6 = lVar6 + 0x10;
        } while ((long)pFVar2->nCol * 0x10 != lVar6);
      }
    }
    pHVar3 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)0x0);
    for (pFVar2 = (FKey *)pHVar3->data; pFVar2 != (FKey *)0x0; pFVar2 = pFVar2->pNextTo) {
      local_38 = (Index *)0x0;
      sqlite3FkLocateIndex(pParse,pTab,pFVar2,&local_38,(int **)0x0);
      if ((local_38 != (Index *)0x0) && ((ulong)local_38->nKeyCol != 0)) {
        uVar4 = 0;
        do {
          uVar5 = 1 << ((byte)local_38->aiColumn[uVar4] & 0x1f);
          if (0x1f < local_38->aiColumn[uVar4]) {
            uVar5 = 0xffffffff;
          }
          uVar7 = uVar7 | uVar5;
          uVar4 = uVar4 + 1;
        } while (local_38->nKeyCol != uVar4);
      }
    }
  }
  return uVar7;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3FkOldmask(
  Parse *pParse,                  /* Parse context */
  Table *pTab                     /* Table being modified */
){
  u32 mask = 0;
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *p;
    int i;
    for(p=pTab->pFKey; p; p=p->pNextFrom){
      for(i=0; i<p->nCol; i++) mask |= COLUMN_MASK(p->aCol[i].iFrom);
    }
    for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
      Index *pIdx = 0;
      sqlite3FkLocateIndex(pParse, pTab, p, &pIdx, 0);
      if( pIdx ){
        for(i=0; i<pIdx->nKeyCol; i++){
          assert( pIdx->aiColumn[i]>=0 );
          mask |= COLUMN_MASK(pIdx->aiColumn[i]);
        }
      }
    }
  }
  return mask;
}